

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *flags,cmGeneratorTarget *target,string *lang,string *config)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer *ppBVar1;
  cmValue lang_00;
  undefined8 config_00;
  bool bVar2;
  ManagedType MVar3;
  char *pcVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  ostream *poVar5;
  ulong uVar6;
  cmake *this_02;
  cmMakefile *pcVar7;
  string *psVar8;
  string_view sVar9;
  undefined1 local_5b0 [8];
  string jmcFlags;
  undefined1 local_580 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec;
  string local_558;
  string local_538;
  undefined1 local_518 [8];
  string isJMCEnabled;
  string local_4f0;
  cmValue local_4d0;
  cmValue jmcExprGen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  cmValue local_488;
  cmValue jmc;
  cmMakefile *mf;
  string wErrorFlags;
  cmAlphaNum local_428;
  string local_3f8;
  cmValue local_3d8;
  cmValue wErrorOpts;
  string local_3c8;
  cmValue local_3a8;
  cmValue wError;
  string compReqFlag;
  string local_378;
  undefined1 local_358 [8];
  ostringstream e;
  cmValue local_1e0;
  cmValue standard;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  cmStandardLevelResolver standardResolver;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetCompileOpts_1;
  string compileFlags;
  string local_170;
  cmValue local_150;
  cmValue targetFlags_1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetCompileOpts;
  string compileOpts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string local_f0;
  cmValue local_d0;
  cmValue targetFlags;
  cmValue local_b8;
  cmValue langFlagRegexStr;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string langFlagRegexVar;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *flags_local;
  cmLocalGenerator *this_local;
  
  langFlagRegexVar.field_2._8_8_ = config;
  cmAlphaNum::cmAlphaNum(&local_80,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&langFlagRegexStr,lang);
  cmStrCat<char[12]>((string *)local_50,&local_80,(cmAlphaNum *)&langFlagRegexStr,
                     (char (*) [12])"_FLAG_REGEX");
  local_b8 = cmMakefile::GetDefinition(this->Makefile,(string *)local_50);
  bVar2 = cmValue::operator_cast_to_bool(&local_b8);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"COMPILE_FLAGS",
               (allocator<char> *)
               ((long)&opts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_d0 = cmGeneratorTarget::GetProperty(target,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&opts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar2 = cmValue::operator_cast_to_bool(&local_d0);
    if (bVar2) {
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&compileOpts.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00);
      cmValue::operator->[abi_cxx11_(&local_d0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::ParseWindowsCommandLine(pcVar4,this_00);
      ppBVar1 = &targetCompileOpts.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)ppBVar1);
      cmValue::operator->[abi_cxx11_(&local_b8);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      AppendCompileOptions
                (this,(string *)ppBVar1,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&compileOpts.field_2 + 8),pcVar4);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targetCompileOpts.
                          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::__cxx11::string::~string
                ((string *)
                 &targetCompileOpts.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&compileOpts.field_2 + 8));
    }
    cmGeneratorTarget::GetCompileOptions
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&targetFlags_1,target,(string *)langFlagRegexVar.field_2._8_8_,lang);
    cmValue::operator->[abi_cxx11_(&local_b8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    AppendCompileOptions
              (this,flags,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&targetFlags_1,pcVar4);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&targetFlags_1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"COMPILE_FLAGS",
               (allocator<char> *)(compileFlags.field_2._M_local_buf + 0xf));
    local_150 = cmGeneratorTarget::GetProperty(target,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)(compileFlags.field_2._M_local_buf + 0xf));
    bVar2 = cmValue::operator_cast_to_bool(&local_150);
    if (bVar2) {
      ppBVar1 = &targetCompileOpts_1.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)ppBVar1);
      psVar8 = cmValue::operator*[abi_cxx11_(&local_150);
      (*this->_vptr_cmLocalGenerator[6])(this,ppBVar1,psVar8);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targetCompileOpts_1.
                          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::__cxx11::string::~string
                ((string *)
                 &targetCompileOpts_1.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    cmGeneratorTarget::GetCompileOptions
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&standardResolver,target,(string *)langFlagRegexVar.field_2._8_8_,lang);
    AppendCompileOptions
              (this,flags,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&standardResolver,(char *)0x0);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&standardResolver);
  }
  cmStandardLevelResolver::cmStandardLevelResolver
            ((cmStandardLevelResolver *)&__range1,this->Makefile);
  this_01 = cmGeneratorTarget::GetMaxLanguageStandards_abi_cxx11_(target);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(this_01);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(this_01);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&wError);
      AddCompilerRequirementFlag
                (this,(string *)&wError,target,lang,(string *)langFlagRegexVar.field_2._8_8_);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &wError);
      }
      this_02 = GetCMakeInstance(this);
      bVar2 = cmake::GetIgnoreWarningAsError(this_02);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"COMPILE_WARNING_AS_ERROR",
                   (allocator<char> *)((long)&wErrorOpts.Value + 7));
        local_3a8 = cmGeneratorTarget::GetProperty(target,&local_3c8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&wErrorOpts.Value + 7));
        pcVar7 = this->Makefile;
        cmAlphaNum::cmAlphaNum(&local_428,"CMAKE_");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&wErrorFlags.field_2 + 8),lang);
        cmStrCat<char[34]>(&local_3f8,&local_428,(cmAlphaNum *)((long)&wErrorFlags.field_2 + 8),
                           (char (*) [34])"_COMPILE_OPTIONS_WARNING_AS_ERROR");
        local_3d8 = cmMakefile::GetDefinition(pcVar7,&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        bVar2 = cmValue::IsOn(&local_3a8);
        if ((bVar2) && (bVar2 = cmValue::IsSet(&local_3d8), bVar2)) {
          std::__cxx11::string::string((string *)&mf);
          psVar8 = cmValue::operator*[abi_cxx11_(&local_3d8);
          AppendCompileOptions(this,(string *)&mf,psVar8,(char *)0x0);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &mf);
          }
          std::__cxx11::string::~string((string *)&mf);
        }
      }
      pcVar7 = GetMakefile(this);
      jmc.Value = (string *)pcVar7;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &jmcExprGen,"CMAKE_",lang);
      std::operator+(&local_4a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &jmcExprGen,"_COMPILE_OPTIONS_JMC");
      local_488 = cmMakefile::GetDefinition(pcVar7,&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&jmcExprGen);
      bVar2 = cmValue::operator_cast_to_bool(&local_488);
      if ((bVar2) &&
         (MVar3 = cmGeneratorTarget::GetManagedType(target,(string *)langFlagRegexVar.field_2._8_8_)
         , MVar3 != Managed)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f0,"VS_JUST_MY_CODE_DEBUGGING",
                   (allocator<char> *)(isJMCEnabled.field_2._M_local_buf + 0xf));
        local_4d0 = cmGeneratorTarget::GetProperty(target,&local_4f0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(isJMCEnabled.field_2._M_local_buf + 0xf));
        bVar2 = cmValue::operator_cast_to_bool(&local_4d0);
        if (bVar2) {
          psVar8 = cmValue::operator*[abi_cxx11_(&local_4d0);
          std::__cxx11::string::string((string *)&local_538,(string *)psVar8);
          config_00 = langFlagRegexVar.field_2._8_8_;
          std::__cxx11::string::string((string *)&local_558);
          cmGeneratorExpression::Evaluate
                    ((string *)local_518,&local_538,this,(string *)config_00,
                     (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                     (cmGeneratorTarget *)0x0,&local_558);
          std::__cxx11::string::~string((string *)&local_558);
          std::__cxx11::string::~string((string *)&local_538);
          sVar9 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_518);
          optVec.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sVar9._M_len;
          bVar2 = cmIsOn(sVar9);
          if (bVar2) {
            psVar8 = cmValue::operator*[abi_cxx11_(&local_488);
            sVar9 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
            jmcFlags.field_2._8_8_ = sVar9._M_len;
            cmExpandedList_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_580,sVar9,false);
            std::__cxx11::string::string((string *)local_5b0);
            AppendCompileOptions
                      (this,(string *)local_5b0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_580,(char *)0x0);
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_5b0);
            }
            std::__cxx11::string::~string((string *)local_5b0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_580);
          }
          std::__cxx11::string::~string((string *)local_518);
        }
      }
      std::__cxx11::string::~string((string *)&wError);
LAB_003d96a5:
      std::__cxx11::string::~string((string *)local_50);
      return;
    }
    standard.Value =
         &std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator*(&__end1)->first;
    local_1e0 = cmGeneratorTarget::GetLanguageStandard
                          (target,standard.Value,(string *)langFlagRegexVar.field_2._8_8_);
    bVar2 = cmValue::operator_cast_to_bool(&local_1e0);
    lang_00 = standard;
    if (bVar2) {
      psVar8 = cmValue::operator*[abi_cxx11_(&local_1e0);
      bVar2 = cmStandardLevelResolver::IsLaterStandard
                        ((cmStandardLevelResolver *)&__range1,lang_00.Value,psVar8,
                         standard.Value + 1);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
        poVar5 = std::operator<<((ostream *)local_358,"The COMPILE_FEATURES property of target \"");
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar5 = std::operator<<(poVar5,(string *)psVar8);
        poVar5 = std::operator<<(poVar5,
                                 "\" was evaluated when computing the link implementation, and the \""
                                );
        poVar5 = std::operator<<(poVar5,(string *)standard.Value);
        poVar5 = std::operator<<(poVar5,"_STANDARD\" was \"");
        poVar5 = std::operator<<(poVar5,(string *)(standard.Value + 1));
        poVar5 = std::operator<<(poVar5,
                                 "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                                );
        poVar5 = std::operator<<(poVar5,(string *)standard.Value);
        poVar5 = std::operator<<(poVar5,"_STANDARD\" \"");
        psVar8 = cmValue::operator*[abi_cxx11_(&local_1e0);
        poVar5 = std::operator<<(poVar5,(string *)psVar8);
        std::operator<<(poVar5,
                        "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation.\n"
                       );
        std::__cxx11::ostringstream::str();
        IssueMessage(this,FATAL_ERROR,&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
        goto LAB_003d96a5;
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::vector<BT<std::string>>& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = cmStrCat("CMAKE_", lang, "_FLAG_REGEX");

  if (cmValue langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    if (cmValue targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      std::vector<std::string> opts;
      cmSystemTools::ParseWindowsCommandLine(targetFlags->c_str(), opts);
      // Re-escape these flags since COMPILE_FLAGS were already parsed
      // as a command line above.
      std::string compileOpts;
      this->AppendCompileOptions(compileOpts, opts, langFlagRegexStr->c_str());
      if (!compileOpts.empty()) {
        flags.emplace_back(std::move(compileOpts));
      }
    }
    std::vector<BT<std::string>> targetCompileOpts =
      target->GetCompileOptions(config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, targetCompileOpts,
                               langFlagRegexStr->c_str());
  } else {
    // Use all flags.
    if (cmValue targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      std::string compileFlags;
      this->AppendFlags(compileFlags, *targetFlags);
      if (!compileFlags.empty()) {
        flags.emplace_back(std::move(compileFlags));
      }
    }
    std::vector<BT<std::string>> targetCompileOpts =
      target->GetCompileOptions(config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, targetCompileOpts);
  }

  cmStandardLevelResolver standardResolver(this->Makefile);
  for (auto const& it : target->GetMaxLanguageStandards()) {
    cmValue standard = target->GetLanguageStandard(it.first, config);
    if (!standard) {
      continue;
    }
    if (standardResolver.IsLaterStandard(it.first, *standard, it.second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it.first << "_STANDARD\" was \"" << it.second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it.first << "_STANDARD\" \"" << *standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation.\n";
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }

  std::string compReqFlag;
  this->AddCompilerRequirementFlag(compReqFlag, target, lang, config);
  if (!compReqFlag.empty()) {
    flags.emplace_back(std::move(compReqFlag));
  }

  // Add Warning as errors flags
  if (!this->GetCMakeInstance()->GetIgnoreWarningAsError()) {
    const cmValue wError = target->GetProperty("COMPILE_WARNING_AS_ERROR");
    const cmValue wErrorOpts = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_WARNING_AS_ERROR"));
    if (wError.IsOn() && wErrorOpts.IsSet()) {
      std::string wErrorFlags;
      this->AppendCompileOptions(wErrorFlags, *wErrorOpts);
      if (!wErrorFlags.empty()) {
        flags.emplace_back(std::move(wErrorFlags));
      }
    }
  }

  // Add compile flag for the MSVC compiler only.
  cmMakefile* mf = this->GetMakefile();
  if (cmValue jmc =
        mf->GetDefinition("CMAKE_" + lang + "_COMPILE_OPTIONS_JMC")) {

    // Handle Just My Code debugging flags, /JMC.
    // If the target is a Managed C++ one, /JMC is not compatible.
    if (target->GetManagedType(config) !=
        cmGeneratorTarget::ManagedType::Managed) {
      // add /JMC flags if target property VS_JUST_MY_CODE_DEBUGGING is set
      // to ON
      if (cmValue jmcExprGen =
            target->GetProperty("VS_JUST_MY_CODE_DEBUGGING")) {
        std::string isJMCEnabled =
          cmGeneratorExpression::Evaluate(*jmcExprGen, this, config);
        if (cmIsOn(isJMCEnabled)) {
          std::vector<std::string> optVec = cmExpandedList(*jmc);
          std::string jmcFlags;
          this->AppendCompileOptions(jmcFlags, optVec);
          if (!jmcFlags.empty()) {
            flags.emplace_back(std::move(jmcFlags));
          }
        }
      }
    }
  }
}